

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlChar * xmlSchemaNormalizeValue(xmlSchemaTypePtr type,xmlChar *value)

{
  xmlSchemaWhitespaceValueType xVar1;
  xmlChar *pxVar2;
  
  xVar1 = xmlSchemaGetWhiteSpaceFacetValue(type);
  if (xVar1 == XML_SCHEMA_WHITESPACE_REPLACE) {
    pxVar2 = xmlSchemaWhiteSpaceReplace(value);
    return pxVar2;
  }
  if (xVar1 == XML_SCHEMA_WHITESPACE_COLLAPSE) {
    pxVar2 = xmlSchemaCollapseString(value);
    return pxVar2;
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlSchemaNormalizeValue(xmlSchemaTypePtr type,
			const xmlChar *value)
{
    switch (xmlSchemaGetWhiteSpaceFacetValue(type)) {
	case XML_SCHEMA_WHITESPACE_COLLAPSE:
	    return (xmlSchemaCollapseString(value));
	case XML_SCHEMA_WHITESPACE_REPLACE:
	    return (xmlSchemaWhiteSpaceReplace(value));
	default:
	    return (NULL);
    }
}